

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomialfit.cpp
# Opt level: O3

fraction * __thiscall
PolynomialFit::calcMatrixUnit(fraction *__return_storage_ptr__,PolynomialFit *this,int x,int y)

{
  int iVar1;
  fraction *in_RAX;
  long lVar2;
  long lVar3;
  
  if (0 < *(int *)((long)__return_storage_ptr__ + 0x38)) {
    iVar1 = *(int *)((long)__return_storage_ptr__ + 0x14);
    lVar2 = 0;
    lVar3 = 0;
    do {
      pow((double)*(longdouble *)(*(long *)(__return_storage_ptr__ + 2) + lVar2),
          (double)(iVar1 * 2 - (x + (int)this)));
      lVar3 = lVar3 + 1;
      in_RAX = (fraction *)(long)*(int *)((long)__return_storage_ptr__ + 0x38);
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < (long)in_RAX);
  }
  return in_RAX;
}

Assistant:

fraction PolynomialFit::calcMatrixUnit(int x, int y)
{
    fraction sum = 0.0;
    double n = 2*degree - x - y  ;
    for(int i=0;i<count;i++)
    {
        sum += pow( (double)sx[i] , n ) * weight[i];
    }

    return sum;
}